

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O1

bool GetUnsigned(uint *out,string *arg_name,uint default_value,
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *args)

{
  bool bVar1;
  char *in_RAX;
  const_iterator cVar2;
  int *piVar3;
  ulong uVar4;
  char *endptr;
  char *local_28;
  
  local_28 = in_RAX;
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&args->_M_t,arg_name);
  if ((_Rb_tree_header *)cVar2._M_node == &(args->_M_t)._M_impl.super__Rb_tree_header) {
    *out = default_value;
LAB_0012137d:
    bVar1 = true;
  }
  else {
    if (cVar2._M_node[2]._M_parent != (_Base_ptr)0x0) {
      piVar3 = __errno_location();
      *piVar3 = 0;
      uVar4 = strtoul(*(char **)(cVar2._M_node + 2),&local_28,10);
      if ((uVar4 != 0xffffffffffffffff) || (*piVar3 != 0x22)) {
        if (uVar4 >> 0x20 != 0) {
          return false;
        }
        if (*local_28 != '\0') {
          return false;
        }
        *out = (uint)uVar4;
        goto LAB_0012137d;
      }
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool GetUnsigned(unsigned *out, const std::string &arg_name,
                 unsigned default_value,
                 const std::map<std::string, std::string> &args) {
  const auto &it = args.find(arg_name);
  if (it == args.end()) {
    *out = default_value;
    return true;
  }

  const std::string &value = it->second;
  if (value.empty()) {
    return false;
  }

  errno = 0;
  char *endptr;
  unsigned long int num = strtoul(value.c_str(), &endptr, 10);
  if (num == ULONG_MAX && errno == ERANGE) {
    return false;
  }
  if (*endptr != 0 || num > UINT_MAX) {
    return false;
  }
  *out = static_cast<unsigned>(num);

  return true;
}